

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_recv(ikcpcb *kcp,char *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  IUINT32 IVar3;
  IKCPSEG *pIVar4;
  IQUEUEHEAD *pIVar5;
  int iVar6;
  int iVar7;
  IKCPSEG *seg_1;
  int fragment;
  IKCPSEG *seg;
  int recover;
  int peeksize;
  int ispeek;
  IQUEUEHEAD *p;
  char *pcStack_20;
  int len_local;
  char *buffer_local;
  ikcpcb *kcp_local;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                  ,0x16b,"int ikcp_recv(ikcpcb *, char *, int)");
  }
  if (&kcp->rcv_queue == (kcp->rcv_queue).next) {
    kcp_local._4_4_ = -1;
  }
  else {
    p._4_4_ = len;
    if (len < 0) {
      p._4_4_ = -len;
    }
    iVar6 = ikcp_peeksize(kcp);
    if (iVar6 < 0) {
      kcp_local._4_4_ = -2;
    }
    else if (p._4_4_ < iVar6) {
      kcp_local._4_4_ = -3;
    }
    else {
      uVar2 = kcp->nrcv_que;
      uVar1 = kcp->rcv_wnd;
      p._4_4_ = 0;
      _peeksize = (IKCPSEG *)(kcp->rcv_queue).next;
      pcStack_20 = buffer;
      do {
        if (_peeksize == (IKCPSEG *)&kcp->rcv_queue) break;
        pIVar4 = (IKCPSEG *)(_peeksize->node).next;
        if (pcStack_20 != (char *)0x0) {
          memcpy(pcStack_20,_peeksize->data,(ulong)_peeksize->len);
          pcStack_20 = pcStack_20 + _peeksize->len;
        }
        p._4_4_ = _peeksize->len + p._4_4_;
        IVar3 = _peeksize->frg;
        iVar7 = ikcp_canlog(kcp,8);
        if (iVar7 != 0) {
          ikcp_log(kcp,8,"recv sn=%lu",(ulong)_peeksize->sn);
        }
        if (-1 < len) {
          ((_peeksize->node).next)->prev = (_peeksize->node).prev;
          ((_peeksize->node).prev)->next = (_peeksize->node).next;
          (_peeksize->node).next = (IQUEUEHEAD *)0x0;
          (_peeksize->node).prev = (IQUEUEHEAD *)0x0;
          ikcp_segment_delete(kcp,_peeksize);
          kcp->nrcv_que = kcp->nrcv_que - 1;
        }
        _peeksize = pIVar4;
      } while (IVar3 != 0);
      if (p._4_4_ != iVar6) {
        __assert_fail("len == peeksize",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                      ,0x199,"int ikcp_recv(ikcpcb *, char *, int)");
      }
      while (((&kcp->rcv_buf != (kcp->rcv_buf).next &&
              (pIVar5 = (kcp->rcv_buf).next, *(IUINT32 *)((long)&pIVar5[2].next + 4) == kcp->rcv_nxt
              )) && (kcp->nrcv_que < kcp->rcv_wnd))) {
        pIVar5->next->prev = pIVar5->prev;
        pIVar5->prev->next = pIVar5->next;
        pIVar5->next = (IQUEUEHEAD *)0x0;
        pIVar5->prev = (IQUEUEHEAD *)0x0;
        kcp->nrcv_buf = kcp->nrcv_buf - 1;
        pIVar5->prev = (kcp->rcv_queue).prev;
        pIVar5->next = &kcp->rcv_queue;
        ((kcp->rcv_queue).prev)->next = pIVar5;
        (kcp->rcv_queue).prev = pIVar5;
        kcp->nrcv_que = kcp->nrcv_que + 1;
        kcp->rcv_nxt = kcp->rcv_nxt + 1;
      }
      if ((kcp->nrcv_que < kcp->rcv_wnd) && (uVar1 <= uVar2)) {
        kcp->probe = kcp->probe | 2;
      }
      kcp_local._4_4_ = p._4_4_;
    }
  }
  return kcp_local._4_4_;
}

Assistant:

int ikcp_recv(ikcpcb *kcp, char *buffer, int len)
{
	struct IQUEUEHEAD *p;
	int ispeek = (len < 0)? 1 : 0;
	int peeksize;
	int recover = 0;
	IKCPSEG *seg;
	assert(kcp);

	if (iqueue_is_empty(&kcp->rcv_queue))
		return -1;

	if (len < 0) len = -len;

	peeksize = ikcp_peeksize(kcp);

	if (peeksize < 0) 
		return -2;

	if (peeksize > len) 
		return -3;

	if (kcp->nrcv_que >= kcp->rcv_wnd)
		recover = 1;

	// merge fragment
	for (len = 0, p = kcp->rcv_queue.next; p != &kcp->rcv_queue; ) {
		int fragment;
		seg = iqueue_entry(p, IKCPSEG, node);
		p = p->next;

		if (buffer) {
			memcpy(buffer, seg->data, seg->len);
			buffer += seg->len;
		}

		len += seg->len;
		fragment = seg->frg;

		if (ikcp_canlog(kcp, IKCP_LOG_RECV)) {
			ikcp_log(kcp, IKCP_LOG_RECV, "recv sn=%lu", seg->sn);
		}

		if (ispeek == 0) {
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
			kcp->nrcv_que--;
		}

		if (fragment == 0) 
			break;
	}

	assert(len == peeksize);

	// move available data from rcv_buf -> rcv_queue
	while (! iqueue_is_empty(&kcp->rcv_buf)) {
		IKCPSEG *seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
		if (seg->sn == kcp->rcv_nxt && kcp->nrcv_que < kcp->rcv_wnd) {
			iqueue_del(&seg->node);
			kcp->nrcv_buf--;
			iqueue_add_tail(&seg->node, &kcp->rcv_queue);
			kcp->nrcv_que++;
			kcp->rcv_nxt++;
		}	else {
			break;
		}
	}

	// fast recover
	if (kcp->nrcv_que < kcp->rcv_wnd && recover) {
		// ready to send back IKCP_CMD_WINS in ikcp_flush
		// tell remote my window size
		kcp->probe |= IKCP_ASK_TELL;
	}

	return len;
}